

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O2

void __thiscall wasm::StackIRGenerator::emitUnreachable(StackIRGenerator *this)

{
  Expression *origin;
  StackInst *local_20;
  
  origin = (Expression *)MixedArena::alloc<wasm::Unreachable>(&this->module->allocator);
  local_20 = makeStackInst(this,origin);
  std::vector<wasm::StackInst*,std::allocator<wasm::StackInst*>>::emplace_back<wasm::StackInst*>
            ((vector<wasm::StackInst*,std::allocator<wasm::StackInst*>> *)&this->stackIR,&local_20);
  return;
}

Assistant:

void emitUnreachable() {
    stackIR.push_back(makeStackInst(Builder(module).makeUnreachable()));
  }